

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O2

cmGeneratedFileStream * __thiscall
cmGeneratedFileStream::Open(cmGeneratedFileStream *this,string *name,bool quiet,bool binaryFlag)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  cmGeneratedFileStreamBase::Open
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8,
             name);
  std::ofstream::open((char *)this,(_Ios_Openmode)*(undefined8 *)&(this->super_ofstream).field_0x118
                     );
  if (((&(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) != 0 && !quiet) {
    std::operator+(&bStack_38,"Cannot open file for write: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_ofstream).field_0x118);
    cmSystemTools::Error(&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
    cmSystemTools::ReportLastSystemError("");
  }
  return this;
}

Assistant:

cmGeneratedFileStream& cmGeneratedFileStream::Open(std::string const& name,
                                                   bool quiet, bool binaryFlag)
{
  // Store the file name and construct the temporary file name.
  this->cmGeneratedFileStreamBase::Open(name);

  // Open the temporary output file.
  if (binaryFlag) {
    this->Stream::open(this->TempName.c_str(),
                       std::ios::out | std::ios::binary);
  } else {
    this->Stream::open(this->TempName.c_str());
  }

  // Check if the file opened.
  if (!*this && !quiet) {
    cmSystemTools::Error("Cannot open file for write: " + this->TempName);
    cmSystemTools::ReportLastSystemError("");
  }
  return *this;
}